

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O0

void __thiscall
HighsSparseMatrix::addRows(HighsSparseMatrix *this,HighsSparseMatrix *new_rows,int8_t *in_partition)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  const_reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  const_reference pvVar7;
  long in_RDX;
  long in_RSI;
  HighsSparseMatrix *in_RDI;
  HighsInt iCol_3;
  HighsInt iEl_4;
  HighsInt last_el;
  HighsInt first_el;
  HighsInt iNewRow_6;
  HighsInt iEl_3;
  HighsInt start_col_plus_1;
  HighsInt iCol_2;
  HighsInt new_iEl;
  HighsInt iEl_2;
  vector<int,_std::allocator<int>_> length;
  HighsInt iNewEl_2;
  HighsInt iNewRow_5;
  HighsInt iEl_1;
  HighsInt iCol_1;
  HighsInt iNewEl_1;
  HighsInt iRow_2;
  HighsInt iNewRow_4;
  HighsInt iRow_1;
  HighsInt iNewRow_3;
  vector<int,_std::allocator<int>_> save_p_end;
  HighsInt iEl;
  HighsInt iCol;
  HighsInt iNewEl;
  HighsInt iRow;
  HighsInt iNewRow_2;
  HighsInt iNewRow_1;
  HighsInt iNewRow;
  HighsInt new_num_row;
  HighsInt new_num_nz;
  HighsInt num_nz;
  HighsInt num_row;
  HighsInt num_col;
  bool partitioned;
  vector<double,_std::allocator<double>_> *new_matrix_value;
  vector<int,_std::allocator<int>_> *new_matrix_index;
  vector<int,_std::allocator<int>_> *new_matrix_start;
  HighsInt num_new_nz;
  HighsInt num_new_row;
  undefined4 in_stack_fffffffffffffe48;
  value_type vVar8;
  undefined4 in_stack_fffffffffffffe4c;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe50;
  value_type vVar9;
  int local_1a4;
  int in_stack_fffffffffffffe60;
  value_type in_stack_fffffffffffffe64;
  size_type in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  int iVar10;
  int local_f8;
  int local_ec;
  int local_e8;
  undefined4 in_stack_ffffffffffffff20;
  int iVar11;
  undefined4 in_stack_ffffffffffffff24;
  int local_d8;
  vector<int,_std::allocator<int>_> local_d0;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  vector<int,_std::allocator<int>_> local_88;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  HighsInt local_44;
  int local_40;
  byte local_39;
  vector<double,_std::allocator<double>_> *local_38;
  vector<int,_std::allocator<int>_> *local_30;
  vector<int,_std::allocator<int>_> *local_28;
  HighsInt local_20;
  int local_1c;
  long local_18;
  
  local_1c = *(int *)(in_RSI + 8);
  local_18 = in_RDX;
  local_20 = numNz((HighsSparseMatrix *)
                   CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  local_28 = (vector<int,_std::allocator<int>_> *)(in_RSI + 0x10);
  local_30 = (vector<int,_std::allocator<int>_> *)(in_RSI + 0x40);
  local_38 = (vector<double,_std::allocator<double>_> *)(in_RSI + 0x58);
  local_39 = in_RDI->format_ == kRowwisePartitioned;
  if (local_1c != 0) {
    local_40 = in_RDI->num_col_;
    local_44 = in_RDI->num_row_;
    local_48 = numNz((HighsSparseMatrix *)
                     CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    bVar1 = isColwise(in_RDI);
    if ((bVar1) && (local_48 < local_20)) {
      ensureRowwise((HighsSparseMatrix *)
                    CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    }
    local_4c = local_48 + local_20;
    local_50 = local_44 + local_1c;
    bVar1 = isRowwise(in_RDI);
    if (bVar1) {
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                 in_stack_fffffffffffffe68);
      if (local_20 == 0) {
        for (local_58 = 0; iVar11 = local_48, local_58 < local_1c; local_58 = local_58 + 1) {
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&in_RDI->start_,(long)(local_44 + local_58));
          *pvVar5 = iVar11;
        }
      }
      else {
        for (local_54 = 0; iVar11 = local_48, local_54 < local_1c; local_54 = local_54 + 1) {
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_28,(long)local_54);
          iVar3 = *pvVar4;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&in_RDI->start_,(long)(local_44 + local_54));
          *pvVar5 = iVar11 + iVar3;
        }
      }
      iVar11 = local_4c;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->start_,(long)local_50);
      *pvVar5 = iVar11;
      if (0 < local_20) {
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                   in_stack_fffffffffffffe68);
        std::vector<double,_std::allocator<double>_>::resize
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                   in_stack_fffffffffffffe68);
        if ((local_39 & 1) == 0) {
          for (local_b8 = 0; local_b8 < local_20; local_b8 = local_b8 + 1) {
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_30,(long)local_b8);
            vVar8 = *pvVar4;
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&in_RDI->index_,(long)(local_48 + local_b8));
            *pvVar5 = vVar8;
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                               (local_38,(long)local_b8);
            vVar9 = *pvVar7;
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&in_RDI->value_,(long)(local_48 + local_b8));
            *pvVar6 = vVar9;
          }
        }
        else {
          for (local_5c = 0; local_5c < local_1c; local_5c = local_5c + 1) {
            local_60 = local_44 + local_5c;
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_28,(long)local_5c);
            for (local_64 = *pvVar4; iVar11 = local_64,
                pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (local_28,(long)(local_5c + 1)), iVar11 < *pvVar4;
                local_64 = local_64 + 1) {
              pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_30,(long)local_64);
              local_68 = *pvVar4;
              if (*(char *)(local_18 + local_68) != '\0') {
                pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (&in_RDI->start_,(long)local_60);
                local_6c = *pvVar5;
                pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_30,(long)local_64)
                ;
                vVar8 = *pvVar4;
                pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (&in_RDI->index_,(long)local_6c);
                *pvVar5 = vVar8;
                pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (local_38,(long)local_64);
                vVar9 = *pvVar7;
                pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (&in_RDI->value_,(long)local_6c);
                *pvVar6 = vVar9;
                pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (&in_RDI->start_,(long)local_60);
                *pvVar5 = *pvVar5 + 1;
              }
            }
          }
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)0x7e787d);
          std::vector<int,_std::allocator<int>_>::resize
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                     in_stack_fffffffffffffe68);
          for (local_98 = 0; iVar11 = local_48, local_98 < local_1c; local_98 = local_98 + 1) {
            local_9c = local_44 + local_98;
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_28,(long)local_98);
            iVar3 = *pvVar4;
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&in_RDI->start_,(long)local_9c);
            *pvVar5 = iVar11 + iVar3;
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&in_RDI->start_,(long)local_9c);
            vVar8 = *pvVar5;
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&in_RDI->p_end_,(long)local_9c);
            *pvVar5 = vVar8;
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&in_RDI->p_end_,(long)local_9c);
            vVar8 = *pvVar5;
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_88,(long)local_98);
            *pvVar5 = vVar8;
          }
          for (local_a0 = 0; local_a0 < local_1c; local_a0 = local_a0 + 1) {
            local_a4 = local_44 + local_a0;
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_28,(long)local_a0);
            for (local_a8 = *pvVar4; iVar11 = local_a8,
                pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (local_28,(long)(local_a0 + 1)), iVar11 < *pvVar4;
                local_a8 = local_a8 + 1) {
              pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_30,(long)local_a8);
              local_ac = *pvVar4;
              if (*(char *)(local_18 + local_ac) == '\0') {
                pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (&in_RDI->p_end_,(long)local_a4);
                local_b0 = *pvVar5;
                pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_30,(long)local_a8)
                ;
                vVar8 = *pvVar4;
                pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (&in_RDI->index_,(long)local_b0);
                *pvVar5 = vVar8;
                pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (local_38,(long)local_a8);
                vVar9 = *pvVar7;
                pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (&in_RDI->value_,(long)local_b0);
                *pvVar6 = vVar9;
                pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (&in_RDI->p_end_,(long)local_a4);
                *pvVar5 = *pvVar5 + 1;
              }
            }
          }
          for (local_b4 = 0; local_b4 < local_1c; local_b4 = local_b4 + 1) {
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_88,(long)local_b4);
            vVar8 = *pvVar5;
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&in_RDI->p_end_,(long)(local_44 + local_b4));
            *pvVar5 = vVar8;
          }
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
        }
      }
    }
    else if (local_20 != 0) {
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x7e7ce0);
      std::vector<int,_std::allocator<int>_>::assign
                (in_stack_fffffffffffffe50,
                 CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                 (value_type_conflict2 *)0x7e7d05);
      for (local_d8 = 0; local_d8 < local_20; local_d8 = local_d8 + 1) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_30,(long)local_d8);
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_d0,(long)*pvVar4);
        *pvVar5 = *pvVar5 + 1;
      }
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                 in_stack_fffffffffffffe68);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                 in_stack_fffffffffffffe68);
      iVar3 = local_4c;
      iVar11 = local_40;
      while (iVar11 = iVar11 + -1, -1 < iVar11) {
        iVar2 = iVar3;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_d0,(long)iVar11);
        iVar2 = iVar2 - *pvVar5;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&in_RDI->start_,(long)(iVar11 + 1));
        local_e8 = *pvVar5;
        while( true ) {
          local_e8 = local_e8 + -1;
          iVar10 = local_e8;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->start_,(long)iVar11);
          if (iVar10 < *pvVar5) break;
          iVar2 = iVar2 + -1;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&in_RDI->index_,(long)local_e8);
          in_stack_fffffffffffffe64 = *pvVar5;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->index_,(long)iVar2);
          *pvVar5 = in_stack_fffffffffffffe64;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->value_,(long)local_e8);
          vVar9 = *pvVar6;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->value_,(long)iVar2);
          *pvVar6 = vVar9;
        }
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&in_RDI->start_,(long)(iVar11 + 1));
        *pvVar5 = iVar3;
        in_stack_fffffffffffffe60 = iVar3;
        iVar3 = iVar2;
      }
      for (local_ec = 0; local_ec < local_1c; local_ec = local_ec + 1) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_28,(long)local_ec);
        local_f8 = *pvVar4;
        if (local_ec < local_1c + -1) {
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_28,(long)(local_ec + 1))
          ;
          local_1a4 = *pvVar4;
        }
        else {
          local_1a4 = local_20;
        }
        for (; local_f8 < local_1a4; local_f8 = local_f8 + 1) {
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_30,(long)local_f8);
          iVar11 = *pvVar4;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&in_RDI->start_,(long)(iVar11 + 1));
          vVar8 = *pvVar5;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_d0,(long)iVar11);
          iVar3 = vVar8 - *pvVar5;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_d0,(long)iVar11);
          *pvVar5 = *pvVar5 + -1;
          iVar11 = local_44 + local_ec;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->index_,(long)iVar3);
          *pvVar5 = iVar11;
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](local_38,(long)local_f8)
          ;
          vVar9 = *pvVar7;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->value_,(long)iVar3);
          *pvVar6 = vVar9;
        }
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
    }
    in_RDI->num_row_ = local_1c + in_RDI->num_row_;
  }
  return;
}

Assistant:

void HighsSparseMatrix::addRows(const HighsSparseMatrix new_rows,
                                const int8_t* in_partition) {
  assert(new_rows.isRowwise());
  const HighsInt num_new_row = new_rows.num_row_;
  const HighsInt num_new_nz = new_rows.numNz();
  const vector<HighsInt>& new_matrix_start = new_rows.start_;
  const vector<HighsInt>& new_matrix_index = new_rows.index_;
  const vector<double>& new_matrix_value = new_rows.value_;

  assert(this->formatOk());
  // Adding rows to a row-wise partitioned matrix needs the
  // partition information
  const bool partitioned = this->format_ == MatrixFormat::kRowwisePartitioned;
  if (partitioned) {
    assert(1 == 0);
    assert(in_partition != NULL);
  }
  assert(num_new_row >= 0);
  assert(num_new_nz >= 0);
  if (num_new_row == 0) {
    // No rows are being added, so check that no nonzeros are being
    // added
    assert(num_new_nz == 0);
    return;
  }
  // Adding a positive number of rows to a matrix
  if (num_new_nz) {
    // Nonzeros are being added, so ensure that non-null data are
    // being passed
    assert(!new_matrix_start.empty());
    assert(!new_matrix_index.empty());
    assert(!new_matrix_value.empty());
  }
  HighsInt num_col = this->num_col_;
  HighsInt num_row = this->num_row_;
  HighsInt num_nz = this->numNz();
  // Check that nonzeros aren't being appended to a matrix with no columns
  assert(num_new_nz <= 0 || num_col > 0);

  if (this->isColwise()) {
    // Matrix is currently a standard col-wise matrix, so flip
    // row-wise if there are more new nonzeros than current nonzeros
    if (num_new_nz > num_nz) this->ensureRowwise();
  }
  // Determine the new number of rows and nonzeros in the matrix
  HighsInt new_num_nz = num_nz + num_new_nz;
  HighsInt new_num_row = num_row + num_new_row;

  if (this->isRowwise()) {
    // Matrix is row-wise
    this->start_.resize(new_num_row + 1);
    // Append the starts of the new rows
    if (num_new_nz) {
      // Nontrivial number of nonzeros being added, so use new_matrix_start
      for (HighsInt iNewRow = 0; iNewRow < num_new_row; iNewRow++)
        this->start_[num_row + iNewRow] = num_nz + new_matrix_start[iNewRow];
    } else {
      // No nonzeros being added, so new_matrix_start may be NULL, but entries
      // of zero are implied.
      for (HighsInt iNewRow = 0; iNewRow < num_new_row; iNewRow++)
        this->start_[num_row + iNewRow] = num_nz;
    }
    this->start_[new_num_row] = new_num_nz;
    if (num_new_nz > 0) {
      // Adding a non-trivial matrix: resize the matrix arrays accordingly
      this->index_.resize(new_num_nz);
      this->value_.resize(new_num_nz);
      // Copy in the new indices and values
      if (partitioned) {
        // Insert the entries in the partition
        assert(1 == 0);
        for (HighsInt iNewRow = 0; iNewRow < num_new_row; iNewRow++) {
          HighsInt iRow = num_row + iNewRow;
          for (HighsInt iNewEl = new_matrix_start[iNewRow];
               iNewEl < new_matrix_start[iNewRow + 1]; iNewEl++) {
            HighsInt iCol = new_matrix_index[iNewEl];
            if (in_partition[iCol]) {
              HighsInt iEl = this->start_[iRow];
              this->index_[iEl] = new_matrix_index[iNewEl];
              this->value_[iEl] = new_matrix_value[iNewEl];
              this->start_[iRow]++;
            }
          }
        }
        // Use the incremented starts to initialise p_end, save these
        // values and reset the starts
        vector<HighsInt> save_p_end;
        save_p_end.resize(num_new_row);
        for (HighsInt iNewRow = 0; iNewRow < num_new_row; iNewRow++) {
          HighsInt iRow = num_row + iNewRow;
          this->start_[iRow] = num_nz + new_matrix_start[iNewRow];
          this->p_end_[iRow] = this->start_[iRow];
          save_p_end[iNewRow] = this->p_end_[iRow];
        }
        // Insert the entries not in the partition
        for (HighsInt iNewRow = 0; iNewRow < num_new_row; iNewRow++) {
          HighsInt iRow = num_row + iNewRow;
          for (HighsInt iNewEl = new_matrix_start[iNewRow];
               iNewEl < new_matrix_start[iNewRow + 1]; iNewEl++) {
            HighsInt iCol = new_matrix_index[iNewEl];
            if (!in_partition[iCol]) {
              HighsInt iEl = this->p_end_[iRow];
              this->index_[iEl] = new_matrix_index[iNewEl];
              this->value_[iEl] = new_matrix_value[iNewEl];
              this->p_end_[iRow]++;
            }
          }
        }
        // Reset p_end using the saved values
        for (HighsInt iNewRow = 0; iNewRow < num_new_row; iNewRow++)
          this->p_end_[num_row + iNewRow] = save_p_end[iNewRow];
      } else {
        for (HighsInt iNewEl = 0; iNewEl < num_new_nz; iNewEl++) {
          this->index_[num_nz + iNewEl] = new_matrix_index[iNewEl];
          this->value_[num_nz + iNewEl] = new_matrix_value[iNewEl];
        }
      }
    }
  } else {
    // Storing the matrix column-wise, so have to insert the new rows
    assert(this->isColwise());
    if (num_new_nz) {
      vector<HighsInt> length;
      length.assign(num_col, 0);
      for (HighsInt iEl = 0; iEl < num_new_nz; iEl++)
        length[new_matrix_index[iEl]]++;
      // Determine the new number of nonzeros and resize the column-wise matrix
      // arrays
      this->index_.resize(new_num_nz);
      this->value_.resize(new_num_nz);
      // Append the new rows
      // Shift the existing columns to make space for the new entries
      HighsInt new_iEl = new_num_nz;
      for (HighsInt iCol = num_col - 1; iCol >= 0; iCol--) {
        HighsInt start_col_plus_1 = new_iEl;
        new_iEl -= length[iCol];
        for (HighsInt iEl = this->start_[iCol + 1] - 1;
             iEl >= this->start_[iCol]; iEl--) {
          new_iEl--;
          this->index_[new_iEl] = this->index_[iEl];
          this->value_[new_iEl] = this->value_[iEl];
        }
        this->start_[iCol + 1] = start_col_plus_1;
      }
      assert(new_iEl == 0);
      // Insert the new entries
      for (HighsInt iNewRow = 0; iNewRow < num_new_row; iNewRow++) {
        HighsInt first_el = new_matrix_start[iNewRow];
        HighsInt last_el =
            (iNewRow < num_new_row - 1 ? new_matrix_start[iNewRow + 1]
                                       : num_new_nz);
        for (HighsInt iEl = first_el; iEl < last_el; iEl++) {
          HighsInt iCol = new_matrix_index[iEl];
          new_iEl = this->start_[iCol + 1] - length[iCol];
          length[iCol]--;
          this->index_[new_iEl] = num_row + iNewRow;
          this->value_[new_iEl] = new_matrix_value[iEl];
        }
      }
    }
  }
  // Update the number of rows
  this->num_row_ += num_new_row;
}